

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDisk.cpp
# Opt level: O1

int __thiscall IDisk::CompareToDisk(IDisk *this,IDisk *other_disk,bool exact)

{
  Side *pSVar1;
  uint uVar2;
  void *__s1;
  void *__s2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  MFMTrack *pMVar6;
  MFMTrack *pMVar7;
  ulong uVar8;
  ulong uVar9;
  Side *pSVar10;
  long lVar11;
  bool bVar12;
  char str [1024];
  int local_468;
  char local_438 [1032];
  
  uVar3 = (uint)other_disk->nb_sides_;
  if (other_disk->nb_sides_ < (byte)*(uint *)&this->nb_sides_) {
    uVar3 = *(uint *)&this->nb_sides_;
  }
  if ((char)uVar3 == '\0') {
    iVar4 = 0;
  }
  else {
    uVar8 = 0;
    while ((!exact || (this->side_[uVar8].nb_tracks == other_disk->side_[uVar8].nb_tracks))) {
      uVar2 = this->side_[uVar8].nb_tracks;
      uVar5 = other_disk->side_[uVar8].nb_tracks;
      if (uVar5 < uVar2) {
        uVar5 = uVar2;
      }
      bVar12 = uVar5 == 0;
      if (bVar12) {
        iVar4 = 0;
      }
      else {
        pSVar1 = this->side_ + uVar8;
        pSVar10 = other_disk->side_ + uVar8;
        lVar11 = 0;
        uVar9 = 0;
        iVar4 = 0;
        do {
          if (exact) {
            pMVar7 = pSVar1->tracks;
            uVar2 = *(uint *)((long)&pMVar7->size + lVar11);
            pMVar6 = pSVar10->tracks;
            if (uVar2 != *(uint *)((long)&pMVar6->size + lVar11)) {
              local_468 = -1;
              break;
            }
            __s1 = *(void **)((long)&pMVar7->bitfield + lVar11);
            if ((__s1 == (void *)0x0) ||
               (__s2 = *(void **)((long)&pMVar6->bitfield + lVar11), __s2 == (void *)0x0)) {
              local_468 = -(uint)(*(long *)((long)&pMVar7->bitfield + lVar11) !=
                                 *(long *)((long)&pMVar6->bitfield + lVar11));
              break;
            }
            iVar4 = bcmp(__s1,__s2,(ulong)uVar2);
            iVar4 = -(uint)(iVar4 != 0);
          }
          else {
            if (uVar9 < pSVar1->nb_tracks) {
              pMVar7 = (MFMTrack *)((long)&pSVar1->tracks->revolution + lVar11);
            }
            else {
              pMVar7 = (MFMTrack *)0x0;
            }
            if (uVar9 < pSVar10->nb_tracks) {
              pMVar6 = (MFMTrack *)((long)&pSVar10->tracks->revolution + lVar11);
            }
            else {
              pMVar6 = (MFMTrack *)0x0;
            }
            iVar4 = CompareTracks(this,pMVar7,pMVar6);
            if (iVar4 == 0) {
              iVar4 = 0;
            }
            else {
              sprintf(local_438,"Erro track = %i",uVar9 & 0xffffffff);
            }
          }
          uVar9 = uVar9 + 1;
          bVar12 = iVar4 != 0 || uVar5 <= uVar9;
          lVar11 = lVar11 + 0x20;
        } while (iVar4 == 0 && uVar5 > uVar9);
      }
      if (!bVar12) {
        return local_468;
      }
      if (iVar4 != 0) {
        return iVar4;
      }
      uVar8 = uVar8 + 1;
      if ((uVar3 & 0xff) <= uVar8) {
        return 0;
      }
    }
    iVar4 = -1;
  }
  return iVar4;
}

Assistant:

int IDisk::CompareToDisk(IDisk* other_disk, bool exact)
{
   int idem = 0;

   int max_side = std::max(nb_sides_, other_disk->nb_sides_);

   for (int side = 0; side < max_side && idem == 0; side ++)
   {
      // For each side :
      if (exact && (side_[side].nb_tracks != other_disk->side_[side].nb_tracks))
      {
         return -1;
      }

      unsigned int maxTrack = std::max(side_[side].nb_tracks, other_disk->side_[side].nb_tracks);
      for (unsigned int track = 0; track < maxTrack && idem == 0; track++)
      {
         // For each track :
         // EXACT comparison ?
         if (exact)
         {
            if (side_[side].tracks[track].size != other_disk->side_[side].tracks[track].size)
            {
               return - 1;
            }
            if (side_[side].tracks[track].bitfield != nullptr && other_disk->side_[side].tracks[track].bitfield !=
               nullptr)
            {
               if (memcmp(side_[side].tracks[track].bitfield, other_disk->side_[side].tracks[track].bitfield,
                          side_[side].tracks[track].size) != 0)
               {
                  idem = -1;
               }
            }
            else
            {
               // ok if both are null
               return (side_[side].tracks[track].bitfield == other_disk->side_[side].tracks[track].bitfield) ? 0 : -1;
            }
         }
         else
         {
            // Otherwise...
            idem = CompareTracks((side_[side].nb_tracks > track) ? (&side_[side].tracks[track]) : nullptr,
                                 (other_disk->side_[side].nb_tracks > track)
                                    ? (&other_disk->side_[side].tracks[track])
                                    : nullptr);
            if (idem != 0)
            {
               char str[1024];
               sprintf(str, "Erro track = %i", track);
               //MessageBox(NULL, str, _T("Compare error"), MB_OK);
            }
         }
      }
   }

   return idem;
}